

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractConsumerStage.h
# Opt level: O3

void __thiscall
teetime::
AbstractConsumerStage<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
::execute(AbstractConsumerStage<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
          *this)

{
  Pipe<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  *pPVar1;
  int iVar2;
  Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  v;
  Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  local_70;
  
  if (this->m_inputport ==
      (InputPort<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
       *)0x0) {
    __assert_fail("m_inputport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/../include/teetime/stages/AbstractConsumerStage.h"
                  ,0x41,
                  "virtual void teetime::AbstractConsumerStage<std::pair<std::basic_string<char>, teetime::Image>>::execute() [T = std::pair<std::basic_string<char>, teetime::Image>]"
                 );
  }
  (*(this->m_inputport->m_pipe->super_AbstractPipe)._vptr_AbstractPipe[4])(&local_70);
  if (local_70.m_hasValue == true) {
    (*(this->super_AbstractStage)._vptr_AbstractStage[4])(this,&local_70);
  }
  else {
    pPVar1 = this->m_inputport->m_pipe;
    if (((pPVar1->super_AbstractPipe).m_closed._M_base._M_i & 1U) != 0) {
      iVar2 = (*(pPVar1->super_AbstractPipe)._vptr_AbstractPipe[7])();
      if ((char)iVar2 != '\0') {
        AbstractStage::terminate(&this->super_AbstractStage);
        goto LAB_0011d4d4;
      }
    }
    sched_yield();
  }
LAB_0011d4d4:
  Optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_teetime::Image>_>
  ::reset(&local_70);
  return;
}

Assistant:

virtual void execute() override final
    {
      assert(m_inputport);

      //TEETIME_DEBUG() << "'execute' stage";
      auto v = m_inputport->receive();
      if(v)
      {
        execute(std::move(*v));
      }
      else if(m_inputport->isClosed())
      {
        terminate();
      }
      else
      {
        std::this_thread::yield();
      }
    }